

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_TestShell::
TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_TestShell
          (TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_TestShell *this)

{
  TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_TestShell_00357860;
  return;
}

Assistant:

TEST(MockCallTest, OnObjectIgnored_InitialMatchDiscarded)
{
    void* objectPtr1 = (void*) 0x001;
    void* objectPtr2 = (void*) 0x002;

    mock().expectOneCall("boo");
    mock().expectOneCall("boo").withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr2).withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr1);
}